

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * get_include_fname(c2m_ctx_t c2m_ctx,token_t t,char **content)

{
  char *name_00;
  int iVar1;
  char *pcVar2;
  str_t sVar3;
  char *local_80;
  long local_70;
  size_t i_2;
  size_t i_1;
  long local_50;
  size_t i;
  char *name;
  char *fullname;
  char **content_local;
  token_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  *content = (char *)0x0;
  if (((short)*(undefined4 *)t != 0x102) && ((short)*(undefined4 *)t != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  name_00 = (t->node->u).s.s;
  if (*name_00 != '/') {
    if (*t->repr == '\"') {
      if (c2m_ctx->cs->fname != (char *)0x0) {
        pcVar2 = get_full_name(c2m_ctx,c2m_ctx->cs->fname,name_00,0);
        iVar1 = file_found_p(pcVar2);
        if (iVar1 != 0) {
          sVar3 = uniq_cstr(c2m_ctx,pcVar2);
          i = (size_t)sVar3.s;
          return (char *)i;
        }
      }
      for (local_50 = 0; c2m_ctx->header_dirs[local_50] != (char *)0x0; local_50 = local_50 + 1) {
        pcVar2 = get_full_name(c2m_ctx,c2m_ctx->header_dirs[local_50],name_00,1);
        iVar1 = file_found_p(pcVar2);
        if (iVar1 != 0) {
          sVar3 = uniq_cstr(c2m_ctx,pcVar2);
          i_1 = (size_t)sVar3.s;
          return (char *)i_1;
        }
      }
    }
    for (i_2 = 0; i_2 < 0xb; i_2 = i_2 + 1) {
      if ((standard_includes[i_2].name != (char *)0x0) &&
         (iVar1 = strcmp(name_00,standard_includes[i_2].name), iVar1 == 0)) {
        *content = standard_includes[i_2].content;
        return name_00;
      }
    }
    for (local_70 = 0; c2m_ctx->system_header_dirs[local_70] != (char *)0x0; local_70 = local_70 + 1
        ) {
      pcVar2 = get_full_name(c2m_ctx,c2m_ctx->system_header_dirs[local_70],name_00,1);
      iVar1 = file_found_p(pcVar2);
      if (iVar1 != 0) {
        sVar3 = uniq_cstr(c2m_ctx,pcVar2);
        local_80 = sVar3.s;
        return local_80;
      }
    }
  }
  return name_00;
}

Assistant:

static const char *get_include_fname (c2m_ctx_t c2m_ctx, token_t t, const char **content) {
  const char *fullname, *name;

  *content = NULL;
  assert (t->code == T_STR || t->code == T_HEADER);
  if ((name = t->node->u.s.s)[0] != '/') {
    if (t->repr[0] == '"') {
      /* Search relative to the current source dir */
      if (cs->fname != NULL) {
        fullname = get_full_name (c2m_ctx, cs->fname, name, FALSE);
        if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
      }
      for (size_t i = 0; header_dirs[i] != NULL; i++) {
        fullname = get_full_name (c2m_ctx, header_dirs[i], name, TRUE);
        if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
      }
    }
    for (size_t i = 0; i < sizeof (standard_includes) / sizeof (string_include_t); i++)
      if (standard_includes[i].name != NULL && strcmp (name, standard_includes[i].name) == 0) {
        *content = standard_includes[i].content;
        return name;
      }
    for (size_t i = 0; system_header_dirs[i] != NULL; i++) {
      fullname = get_full_name (c2m_ctx, system_header_dirs[i], name, TRUE);
      if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
    }
  }
  return name;
}